

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O1

FilePath * de::FilePath::normalize(FilePath *__return_storage_ptr__,FilePath *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FilePath local_38;
  
  paVar1 = &local_38.m_path.field_2;
  pcVar2 = (path->m_path)._M_dataplus._M_p;
  local_38.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (path->m_path)._M_string_length);
  normalize(&local_38);
  (__return_storage_ptr__->m_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_path).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38.m_path._M_dataplus._M_p,
             local_38.m_path._M_dataplus._M_p + local_38.m_path._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.m_path._M_dataplus._M_p,
                    local_38.m_path.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::normalize (const FilePath& path)
{
	return FilePath(path).normalize();
}